

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O3

CpuInfo * asmjit::CpuInfo::getHost(void)

{
  if (getHost()::host == '\0') {
    getHost();
  }
  return &getHost::host.super_CpuInfo;
}

Assistant:

const CpuInfo& CpuInfo::getHost() noexcept {
  static HostCpuInfo host;
  return host;
}